

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int valueFromExpr(sqlite3 *db,Expr *pExpr,u8 enc,u8 affinity,sqlite3_value **ppVal,
                 ValueNewStat4Ctx *pCtx)

{
  u8 uVar1;
  int iVar2;
  int iVar3;
  sqlite3_value *pRec;
  MemValue MVar4;
  char *pcVar5;
  sqlite3_value **xDel;
  byte bVar6;
  long lStack_50;
  sqlite3_value *local_38;
  
  local_38 = (Mem *)0x0;
  for (; (bVar6 = pExpr->op, bVar6 == 0xa2 || (bVar6 == 0xa9)); pExpr = pExpr->pLeft) {
  }
  if (bVar6 == 0xa4) {
    bVar6 = pExpr->op2;
  }
  if (bVar6 == 0xa1) {
    pExpr = pExpr->pLeft;
    bVar6 = pExpr->op;
    if ((bVar6 | 2) != 0x8f) {
      iVar3 = valueFromExpr(db,pExpr,enc,affinity,&local_38,pCtx);
      pRec = local_38;
      iVar2 = 0;
      if (local_38 != (Mem *)0x0 && iVar3 == 0) {
        sqlite3VdbeMemNumerify(local_38);
        if ((pRec->flags & 8) == 0) {
          (pRec->u).i = -(pRec->u).i;
        }
        else {
          (pRec->u).i = (pRec->u).i ^ 0x8000000000000000;
        }
        applyAffinity(pRec,affinity,enc);
      }
      goto LAB_001507f8;
    }
    pcVar5 = "-";
    lStack_50 = -1;
  }
  else {
    if (bVar6 == 0x24) {
      uVar1 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      iVar2 = valueFromExpr(db,pExpr->pLeft,enc,uVar1,ppVal,pCtx);
      if (*ppVal == (Mem *)0x0) {
        return iVar2;
      }
      sqlite3VdbeMemCast(*ppVal,uVar1,'\x01');
      applyAffinity(*ppVal,affinity,'\x01');
      return iVar2;
    }
    pcVar5 = "";
    lStack_50 = 1;
  }
  if (bVar6 == 0x6a) {
LAB_001505bc:
    xDel = ppVal;
    pRec = sqlite3ValueNew(db);
    if (pRec != (sqlite3_value *)0x0) {
      if ((pExpr->flags & 0x400) == 0) {
        pcVar5 = sqlite3MPrintf(db,"%s%s",pcVar5,(pExpr->u).zToken);
        if (pcVar5 == (char *)0x0) goto LAB_00150744;
        sqlite3ValueSetStr(pRec,(int)pcVar5,(void *)0x1,'\n',(_func_void_void_ptr *)xDel);
      }
      else {
        sqlite3VdbeMemSetInt64(pRec,lStack_50 * (pExpr->u).iValue);
      }
      uVar1 = 'C';
      if (affinity != 'A' || (bVar6 & 0xfd) != 0x8d) {
        uVar1 = affinity;
      }
      applyAffinity(pRec,uVar1,'\x01');
      if ((pRec->flags & 0xc) != 0) {
        pRec->flags = pRec->flags & 0xfffd;
      }
      iVar2 = 0;
      if (enc != '\x01') {
        iVar2 = sqlite3VdbeChangeEncoding(pRec,(uint)enc);
      }
LAB_001507f8:
      *ppVal = pRec;
      return iVar2;
    }
  }
  else {
    if (bVar6 != 0x6e) {
      if (bVar6 != 0x8d) {
        if (bVar6 == 0x8e) {
          pRec = sqlite3ValueNew(db);
          iVar2 = 0;
          if (pRec != (sqlite3_value *)0x0) {
            pcVar5 = (pExpr->u).zToken;
            iVar3 = sqlite3Strlen30(pcVar5 + 2);
            pcVar5 = (char *)sqlite3HexToBlob(db,pcVar5 + 2,iVar3 + -1);
            sqlite3VdbeMemSetStr(pRec,pcVar5,(iVar3 + -1) / 2,'\0',sqlite3MallocSize);
            goto LAB_001507f8;
          }
          goto LAB_00150741;
        }
        iVar2 = 0;
        if (bVar6 == 0x9b) {
          pRec = sqlite3ValueNew(db);
          pRec->flags = 4;
          MVar4.i._1_7_ = 0;
          MVar4.i._0_1_ = (pExpr->u).zToken[4] == '\0';
          pRec->u = MVar4;
          goto LAB_001507f8;
        }
        if (bVar6 != 0x8f) {
          pRec = (sqlite3_value *)0x0;
          iVar2 = 0;
          goto LAB_001507f8;
        }
      }
      goto LAB_001505bc;
    }
    pRec = sqlite3ValueNew(db);
    iVar2 = 0;
    if (pRec != (sqlite3_value *)0x0) {
      sqlite3VdbeMemNumerify(pRec);
      goto LAB_001507f8;
    }
  }
LAB_00150741:
  pRec = (sqlite3_value *)0x0;
LAB_00150744:
  sqlite3OomFault(db);
  sqlite3DbFree(db,(void *)0x0);
  sqlite3ValueFree(pRec);
  return 7;
}

Assistant:

static int valueFromExpr(
  sqlite3 *db,                    /* The database connection */
  Expr *pExpr,                    /* The expression to evaluate */
  u8 enc,                         /* Encoding to use */
  u8 affinity,                    /* Affinity to use */
  sqlite3_value **ppVal,          /* Write the new value here */
  struct ValueNewStat4Ctx *pCtx   /* Second argument for valueNew() */
){
  int op;
  char *zVal = 0;
  sqlite3_value *pVal = 0;
  int negInt = 1;
  const char *zNeg = "";
  int rc = SQLITE_OK;

  assert( pExpr!=0 );
  while( (op = pExpr->op)==TK_UPLUS || op==TK_SPAN ) pExpr = pExpr->pLeft;
#if defined(SQLITE_ENABLE_STAT3_OR_STAT4)
  if( op==TK_REGISTER ) op = pExpr->op2;
#else
  if( NEVER(op==TK_REGISTER) ) op = pExpr->op2;
#endif

  /* Compressed expressions only appear when parsing the DEFAULT clause
  ** on a table column definition, and hence only when pCtx==0.  This
  ** check ensures that an EP_TokenOnly expression is never passed down
  ** into valueFromFunction(). */
  assert( (pExpr->flags & EP_TokenOnly)==0 || pCtx==0 );

  if( op==TK_CAST ){
    u8 aff = sqlite3AffinityType(pExpr->u.zToken,0);
    rc = valueFromExpr(db, pExpr->pLeft, enc, aff, ppVal, pCtx);
    testcase( rc!=SQLITE_OK );
    if( *ppVal ){
      sqlite3VdbeMemCast(*ppVal, aff, SQLITE_UTF8);
      sqlite3ValueApplyAffinity(*ppVal, affinity, SQLITE_UTF8);
    }
    return rc;
  }

  /* Handle negative integers in a single step.  This is needed in the
  ** case when the value is -9223372036854775808.
  */
  if( op==TK_UMINUS
   && (pExpr->pLeft->op==TK_INTEGER || pExpr->pLeft->op==TK_FLOAT) ){
    pExpr = pExpr->pLeft;
    op = pExpr->op;
    negInt = -1;
    zNeg = "-";
  }

  if( op==TK_STRING || op==TK_FLOAT || op==TK_INTEGER ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    if( ExprHasProperty(pExpr, EP_IntValue) ){
      sqlite3VdbeMemSetInt64(pVal, (i64)pExpr->u.iValue*negInt);
    }else{
      zVal = sqlite3MPrintf(db, "%s%s", zNeg, pExpr->u.zToken);
      if( zVal==0 ) goto no_mem;
      sqlite3ValueSetStr(pVal, -1, zVal, SQLITE_UTF8, SQLITE_DYNAMIC);
    }
    if( (op==TK_INTEGER || op==TK_FLOAT ) && affinity==SQLITE_AFF_BLOB ){
      sqlite3ValueApplyAffinity(pVal, SQLITE_AFF_NUMERIC, SQLITE_UTF8);
    }else{
      sqlite3ValueApplyAffinity(pVal, affinity, SQLITE_UTF8);
    }
    if( pVal->flags & (MEM_Int|MEM_Real) ) pVal->flags &= ~MEM_Str;
    if( enc!=SQLITE_UTF8 ){
      rc = sqlite3VdbeChangeEncoding(pVal, enc);
    }
  }else if( op==TK_UMINUS ) {
    /* This branch happens for multiple negative signs.  Ex: -(-5) */
    if( SQLITE_OK==valueFromExpr(db,pExpr->pLeft,enc,affinity,&pVal,pCtx) 
     && pVal!=0
    ){
      sqlite3VdbeMemNumerify(pVal);
      if( pVal->flags & MEM_Real ){
        pVal->u.r = -pVal->u.r;
      }else if( pVal->u.i==SMALLEST_INT64 ){
        pVal->u.r = -(double)SMALLEST_INT64;
        MemSetTypeFlag(pVal, MEM_Real);
      }else{
        pVal->u.i = -pVal->u.i;
      }
      sqlite3ValueApplyAffinity(pVal, affinity, enc);
    }
  }else if( op==TK_NULL ){
    pVal = valueNew(db, pCtx);
    if( pVal==0 ) goto no_mem;
    sqlite3VdbeMemNumerify(pVal);
  }
#ifndef SQLITE_OMIT_BLOB_LITERAL
  else if( op==TK_BLOB ){
    int nVal;
    assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
    assert( pExpr->u.zToken[1]=='\'' );
    pVal = valueNew(db, pCtx);
    if( !pVal ) goto no_mem;
    zVal = &pExpr->u.zToken[2];
    nVal = sqlite3Strlen30(zVal)-1;
    assert( zVal[nVal]=='\'' );
    sqlite3VdbeMemSetStr(pVal, sqlite3HexToBlob(db, zVal, nVal), nVal/2,
                         0, SQLITE_DYNAMIC);
  }
#endif
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  else if( op==TK_FUNCTION && pCtx!=0 ){
    rc = valueFromFunction(db, pExpr, enc, affinity, &pVal, pCtx);
  }
#endif
  else if( op==TK_TRUEFALSE ){
     pVal = valueNew(db, pCtx);
     pVal->flags = MEM_Int;
     pVal->u.i = pExpr->u.zToken[4]==0;
  }

  *ppVal = pVal;
  return rc;

no_mem:
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 || pCtx->pParse->nErr==0 )
#endif
    sqlite3OomFault(db);
  sqlite3DbFree(db, zVal);
  assert( *ppVal==0 );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx==0 ) sqlite3ValueFree(pVal);
#else
  assert( pCtx==0 ); sqlite3ValueFree(pVal);
#endif
  return SQLITE_NOMEM_BKPT;
}